

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

bool __thiscall draco::CornerTable::ComputeOppositeCorners(CornerTable *this,int *num_vertices)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  undefined4 *in_RSI;
  long in_RDI;
  int i_2;
  int num_corners_on_source_vert;
  int j;
  VertexIndex other_v;
  int i_1;
  int num_corners_on_vert;
  CornerIndex opposite_c;
  VertexIndex v0;
  FaceIndex face_index;
  VertexIndex sink_v;
  VertexIndex source_v;
  VertexIndex tip_v;
  CornerIndex c_1;
  size_t i;
  int offset;
  vector<int,_std::allocator<int>_> vertex_offset;
  vector<VertexEdgePair,_std::allocator<VertexEdgePair>_> vertex_edges;
  VertexIndex v1;
  CornerIndex c;
  vector<int,_std::allocator<int>_> num_corners_on_vertices;
  CornerTable *in_stack_fffffffffffffe08;
  VertexEdgePair *in_stack_fffffffffffffe10;
  CornerTable *in_stack_fffffffffffffe18;
  CornerIndex in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  vector<VertexEdgePair,_std::allocator<VertexEdgePair>_> *in_stack_fffffffffffffe30;
  vector<VertexEdgePair,_std::allocator<VertexEdgePair>_> *this_00;
  size_type in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  int local_10c;
  int local_104;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_fc;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_f8;
  int local_f4;
  value_type local_f0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_dc;
  uint local_d8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_c0;
  uint local_bc;
  uint local_b8;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_b4;
  uint local_b0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_ac;
  uint local_a8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_a4;
  ulong local_a0;
  int local_98;
  vector<int,_std::allocator<int>_> local_90;
  VertexEdgePair local_70;
  vector<VertexEdgePair,_std::allocator<VertexEdgePair>_> local_68;
  undefined4 local_50;
  uint local_4c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_48;
  uint local_44;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_40 [4];
  vector<int,_std::allocator<int>_> local_30;
  undefined4 *local_18;
  byte local_1;
  
  if (in_RSI == (undefined4 *)0x0) {
    local_1 = 0;
  }
  else {
    local_18 = in_RSI;
    num_corners((CornerTable *)0x1b2c4b);
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
    ::resize((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
              *)in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08,
             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)0x1b2c62);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b2c6f);
    num_corners((CornerTable *)0x1b2c7c);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(local_40,0);
    while( true ) {
      local_44 = num_corners((CornerTable *)0x1b2cbe);
      bVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<(local_40,&local_44);
      if (!bVar3) break;
      local_4c = local_40[0].value_;
      local_48.value_ = (uint)Vertex(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
      uVar4 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_48);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_30);
      if ((uint)sVar5 <= uVar4) {
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_48);
        local_50 = 0;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38,(value_type_conflict1 *)in_stack_fffffffffffffe30);
      }
      uVar4 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_48);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)uVar4);
      *pvVar6 = *pvVar6 + 1;
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator++(local_40);
    }
    num_corners((CornerTable *)0x1b2e21);
    ComputeOppositeCorners::VertexEdgePair::VertexEdgePair(&local_70);
    std::allocator<VertexEdgePair>::allocator((allocator<VertexEdgePair> *)0x1b2e5f);
    std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::vector
              (in_stack_fffffffffffffe30,
               CONCAT17(in_stack_fffffffffffffe2f,
                        CONCAT16(in_stack_fffffffffffffe2e,
                                 CONCAT24(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))),
               (value_type *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20.value_),
               (allocator_type *)in_stack_fffffffffffffe18);
    std::allocator<VertexEdgePair>::~allocator((allocator<VertexEdgePair> *)0x1b2e93);
    std::vector<int,_std::allocator<int>_>::size(&local_30);
    std::allocator<int>::allocator((allocator<int> *)0x1b2ebd);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30,
               CONCAT17(in_stack_fffffffffffffe2f,
                        CONCAT16(in_stack_fffffffffffffe2e,
                                 CONCAT24(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))),
               (allocator_type *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20.value_));
    std::allocator<int>::~allocator((allocator<int> *)0x1b2ee9);
    local_98 = 0;
    for (local_a0 = 0; uVar2 = local_a0,
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_30), iVar1 = local_98,
        uVar2 < sVar5; local_a0 = local_a0 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,local_a0);
      *pvVar6 = iVar1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,local_a0);
      local_98 = *pvVar6 + local_98;
    }
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_a4,0);
LAB_001b2ffa:
    local_a8 = num_corners((CornerTable *)0x1b3007);
    bVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<(&local_a4,&local_a8);
    if (bVar3) {
      local_b0 = local_a4.value_;
      local_ac.value_ = (uint)Vertex(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
      local_bc = local_a4.value_;
      local_b8 = (uint)Next(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
      local_b4.value_ = (uint)Vertex(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
      local_c8 = local_a4.value_;
      local_c4 = (uint)Previous(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
      local_c0.value_ = (uint)Vertex(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
      local_d0 = local_a4.value_;
      local_d8 = (uint)Face(in_stack_fffffffffffffe08,(CornerIndex)(uint)in_stack_fffffffffffffe10);
      local_cc = local_d8;
      local_d4.value_ = (uint)FirstCorner(in_stack_fffffffffffffe08,(uint)in_stack_fffffffffffffe10)
      ;
      bVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==(&local_a4,&local_d4)
      ;
      if (!bVar3) {
LAB_001b32c7:
        local_ec.value_ = 0xffffffff;
        uVar4 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_c0);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)uVar4);
        local_f0 = *pvVar6;
        uVar4 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_c0);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,(ulong)uVar4);
        local_98 = *pvVar6;
        for (local_f4 = 0; local_f4 < local_f0; local_f4 = local_f4 + 1) {
          pvVar7 = std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
                             (&local_68,(long)local_98);
          local_f8.value_ = (pvVar7->sink_vert).value_;
          bVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                            (&local_f8,
                             (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                             &kInvalidVertexIndex);
          if (bVar3) break;
          bVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                            (&local_f8,&local_b4);
          if (bVar3) {
            std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
                      (&local_68,(long)local_98);
            local_fc.value_ = (uint)Vertex(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
            bVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                              (&local_ac,&local_fc);
            if (!bVar3) {
              pvVar7 = std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
                                 (&local_68,(long)local_98);
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
                        (&local_ec,&pvVar7->edge_corner);
              local_104 = local_f4;
              goto LAB_001b346c;
            }
          }
          local_98 = local_98 + 1;
        }
        goto LAB_001b3574;
      }
      local_e0 = local_a4.value_;
      local_dc.value_ = (uint)Vertex(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
      bVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==(&local_dc,&local_b4)
      ;
      if (((!bVar3) &&
          (bVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                             (&local_dc,&local_c0), !bVar3)) &&
         (bVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                            (&local_b4,&local_c0), !bVar3)) goto LAB_001b32c7;
      *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) + 1;
      local_e4 = 2;
      local_e8 = (uint)IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+=
                                 (&local_a4,&local_e4);
      goto LAB_001b373b;
    }
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_30);
    *local_18 = (int)sVar5;
    local_1 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20.value_));
    std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::~vector
              ((vector<VertexEdgePair,_std::allocator<VertexEdgePair>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20.value_));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20.value_));
  }
  return (bool)(local_1 & 1);
LAB_001b346c:
  local_104 = local_104 + 1;
  if (local_f0 <= local_104) goto LAB_001b3523;
  this_00 = &local_68;
  std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
            (this_00,(long)(local_98 + 1));
  std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[](this_00,(long)local_98);
  ComputeOppositeCorners::VertexEdgePair::operator=
            (in_stack_fffffffffffffe10,(VertexEdgePair *)in_stack_fffffffffffffe08);
  pvVar7 = std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
                     (&local_68,(long)local_98);
  bVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                    (&pvVar7->sink_vert,
                     (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)&kInvalidVertexIndex);
  if (bVar3) goto LAB_001b3523;
  local_98 = local_98 + 1;
  goto LAB_001b346c;
LAB_001b3523:
  pvVar7 = std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
                     (&local_68,(long)local_98);
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=
            (&pvVar7->sink_vert,(ThisIndexType *)&kInvalidVertexIndex);
LAB_001b3574:
  bVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                    (&local_ec,
                     (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex);
  if (bVar3) {
    uVar4 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_b4);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(ulong)uVar4);
    iVar1 = *pvVar6;
    in_stack_fffffffffffffe24 =
         IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_b4);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&local_90,(ulong)in_stack_fffffffffffffe24);
    local_98 = *pvVar6;
    for (local_10c = 0; local_10c < iVar1; local_10c = local_10c + 1) {
      pvVar7 = std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
                         (&local_68,(long)local_98);
      bVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                        (&pvVar7->sink_vert,
                         (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                         &kInvalidVertexIndex);
      in_stack_fffffffffffffe20.value_ = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe20.value_);
      if (bVar3) {
        pvVar7 = std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
                           (&local_68,(long)local_98);
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=
                  (&pvVar7->sink_vert,&local_c0);
        pvVar7 = std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::operator[]
                           (&local_68,(long)local_98);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
                  (&pvVar7->edge_corner,&local_a4);
        break;
      }
      local_98 = local_98 + 1;
    }
  }
  else {
    in_stack_fffffffffffffe18 =
         (CornerTable *)
         IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
         ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
                       *)in_stack_fffffffffffffe10,
                      (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                      in_stack_fffffffffffffe08);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
              ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffe18,
               &local_ec);
    in_stack_fffffffffffffe10 =
         (VertexEdgePair *)
         IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
         ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
                       *)in_stack_fffffffffffffe10,
                      (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                      in_stack_fffffffffffffe08);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=
              ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_fffffffffffffe10,
               &local_a4);
  }
LAB_001b373b:
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator++(&local_a4);
  goto LAB_001b2ffa;
}

Assistant:

bool CornerTable::ComputeOppositeCorners(int *num_vertices) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  if (num_vertices == nullptr) {
    return false;
  }
  opposite_corners_.resize(num_corners(), kInvalidCornerIndex);

  // Out implementation for finding opposite corners is based on keeping track
  // of outgoing half-edges for each vertex of the mesh. Half-edges (defined by
  // their opposite corners) are processed one by one and whenever a new
  // half-edge (corner) is processed, we check whether the sink vertex of
  // this half-edge contains its sibling half-edge. If yes, we connect them and
  // remove the sibling half-edge from the sink vertex, otherwise we add the new
  // half-edge to its source vertex.

  // First compute the number of outgoing half-edges (corners) attached to each
  // vertex.
  std::vector<int> num_corners_on_vertices;
  num_corners_on_vertices.reserve(num_corners());
  for (CornerIndex c(0); c < num_corners(); ++c) {
    const VertexIndex v1 = Vertex(c);
    if (v1.value() >= static_cast<int>(num_corners_on_vertices.size())) {
      num_corners_on_vertices.resize(v1.value() + 1, 0);
    }
    // For each corner there is always exactly one outgoing half-edge attached
    // to its vertex.
    num_corners_on_vertices[v1.value()]++;
  }

  // Create a storage for half-edges on each vertex. We store all half-edges in
  // one array, where each entry is identified by the half-edge's sink vertex id
  // and the associated half-edge corner id (corner opposite to the half-edge).
  // Each vertex will be assigned storage for up to
  // |num_corners_on_vertices[vert_id]| half-edges. Unused half-edges are marked
  // with |sink_vert| == kInvalidVertexIndex.
  struct VertexEdgePair {
    VertexEdgePair()
        : sink_vert(kInvalidVertexIndex), edge_corner(kInvalidCornerIndex) {}
    VertexIndex sink_vert;
    CornerIndex edge_corner;
  };
  std::vector<VertexEdgePair> vertex_edges(num_corners(), VertexEdgePair());

  // For each vertex compute the offset (location where the first half-edge
  // entry of a given vertex is going to be stored). This way each vertex is
  // guaranteed to have a non-overlapping storage with respect to the other
  // vertices.
  std::vector<int> vertex_offset(num_corners_on_vertices.size());
  int offset = 0;
  for (size_t i = 0; i < num_corners_on_vertices.size(); ++i) {
    vertex_offset[i] = offset;
    offset += num_corners_on_vertices[i];
  }

  // Now go over the all half-edges (using their opposite corners) and either
  // insert them to the |vertex_edge| array or connect them with existing
  // half-edges.
  for (CornerIndex c(0); c < num_corners(); ++c) {
    const VertexIndex tip_v = Vertex(c);
    const VertexIndex source_v = Vertex(Next(c));
    const VertexIndex sink_v = Vertex(Previous(c));

    const FaceIndex face_index = Face(c);
    if (c == FirstCorner(face_index)) {
      // Check whether the face is degenerated, if so ignore it.
      const VertexIndex v0 = Vertex(c);
      if (v0 == source_v || v0 == sink_v || source_v == sink_v) {
        ++num_degenerated_faces_;
        c += 2;  // Ignore the next two corners of the same face.
        continue;
      }
    }

    CornerIndex opposite_c(kInvalidCornerIndex);
    // The maximum number of half-edges attached to the sink vertex.
    const int num_corners_on_vert = num_corners_on_vertices[sink_v.value()];
    // Where to look for the first half-edge on the sink vertex.
    offset = vertex_offset[sink_v.value()];
    for (int i = 0; i < num_corners_on_vert; ++i, ++offset) {
      const VertexIndex other_v = vertex_edges[offset].sink_vert;
      if (other_v == kInvalidVertexIndex) {
        break;  // No matching half-edge found on the sink vertex.
      }
      if (other_v == source_v) {
        if (tip_v == Vertex(vertex_edges[offset].edge_corner)) {
          continue;  // Don't connect mirrored faces.
        }
        // A matching half-edge was found on the sink vertex. Mark the
        // half-edge's opposite corner.
        opposite_c = vertex_edges[offset].edge_corner;
        // Remove the half-edge from the sink vertex. We remap all subsequent
        // half-edges one slot down.
        // TODO(ostava): This can be optimized a little bit, by remapping only
        // the half-edge on the last valid slot into the deleted half-edge's
        // slot.
        for (int j = i + 1; j < num_corners_on_vert; ++j, ++offset) {
          vertex_edges[offset] = vertex_edges[offset + 1];
          if (vertex_edges[offset].sink_vert == kInvalidVertexIndex) {
            break;  // Unused half-edge reached.
          }
        }
        // Mark the last entry as unused.
        vertex_edges[offset].sink_vert = kInvalidVertexIndex;
        break;
      }
    }
    if (opposite_c == kInvalidCornerIndex) {
      // No opposite corner found. Insert the new edge
      const int num_corners_on_source_vert =
          num_corners_on_vertices[source_v.value()];
      offset = vertex_offset[source_v.value()];
      for (int i = 0; i < num_corners_on_source_vert; ++i, ++offset) {
        // Find the first unused half-edge slot on the source vertex.
        if (vertex_edges[offset].sink_vert == kInvalidVertexIndex) {
          vertex_edges[offset].sink_vert = sink_v;
          vertex_edges[offset].edge_corner = c;
          break;
        }
      }
    } else {
      // Opposite corner found.
      opposite_corners_[c] = opposite_c;
      opposite_corners_[opposite_c] = c;
    }
  }
  *num_vertices = static_cast<int>(num_corners_on_vertices.size());
  return true;
}